

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_emit_binary_left(Parser *psr,Tk binop,Node *left)

{
  _Bool _Var1;
  Node *left_local;
  Tk binop_local;
  Parser *psr_local;
  
  _Var1 = binop_is_arith(binop);
  if (_Var1) {
    if (left->type == NODE_NUM) {
      return;
    }
    if (left->type == NODE_PRIM) {
      psr_trigger_err(psr,"invalid operand to binary operator");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x3ef,"void expr_emit_binary_left(Parser *, Tk, Node *)");
    }
  }
  else {
    _Var1 = binop_is_rel(binop);
    if (_Var1) {
      if (left->type == NODE_NUM) {
        return;
      }
      _Var1 = binop_is_rel(binop);
      if ((_Var1) && (left->type == NODE_PRIM)) {
        psr_trigger_err(psr,"invalid operand to binary operator");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x3f9,"void expr_emit_binary_left(Parser *, Tk, Node *)");
      }
    }
    else if ((binop == 0x10a) || (binop == 0x10b)) {
      expr_to_jmp(psr,left);
      return;
    }
  }
  expr_to_ins_arg(psr,left);
  return;
}

Assistant:

static void expr_emit_binary_left(Parser *psr, Tk binop, Node *left) {
	// All instruction arguments need to fit into a uint8_t. There's some
	// exceptions to this, which are all handled individually below.

	// There's specialised instructions for arithmetic with numbers and locals
	if (binop_is_arith(binop)) {
		if (left->type == NODE_NUM) {
			return;
		} else if (left->type == NODE_PRIM) {
			// Invalid operator
			psr_trigger_err(psr, "invalid operand to binary operator");
			UNREACHABLE();
		}
	} else if (binop_is_rel(binop)) {
		if (left->type == NODE_NUM) {
			// There are specialised instructions for number operations, like
			// arithmetic operands
			return;
		} else if (binop_is_rel(binop) && left->type == NODE_PRIM) {
			// Can't give primitives to order operations
			psr_trigger_err(psr, "invalid operand to binary operator");
			UNREACHABLE();
		}
	} else if (binop == TK_AND || binop == TK_OR) {
		// Turn the operand into a jump, if necessary
		expr_to_jmp(psr, left);
		return;
	}

	// Otherwise, ensure the node is usable as an instruction argument
	expr_to_ins_arg(psr, left);
}